

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::GLSL420Pack::QualifierOrderFunctionInoutTest::testInit
          (QualifierOrderFunctionInoutTest *this)

{
  QUALIFIERS QVar1;
  QUALIFIERS QVar2;
  QUALIFIERS local_2c;
  
  std::
  vector<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
  ::resize(&this->m_test_cases,6);
  local_2c = QUAL_HIGHP;
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::emplace_back<gl4cts::GLSL420Pack::Utils::QUALIFIERS>
            ((this->m_test_cases).
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_2c);
  QVar1 = QUAL_PRECISE;
  local_2c = QVar1;
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::emplace_back<gl4cts::GLSL420Pack::Utils::QUALIFIERS>
            ((this->m_test_cases).
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_2c);
  QVar2 = QUAL_INOUT;
  local_2c = QVar2;
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::emplace_back<gl4cts::GLSL420Pack::Utils::QUALIFIERS>
            ((this->m_test_cases).
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_2c);
  local_2c = QVar2;
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::emplace_back<gl4cts::GLSL420Pack::Utils::QUALIFIERS>
            ((this->m_test_cases).
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1,&local_2c);
  local_2c = QVar1;
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::emplace_back<gl4cts::GLSL420Pack::Utils::QUALIFIERS>
            ((this->m_test_cases).
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1,&local_2c);
  local_2c = QUAL_HIGHP;
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::emplace_back<gl4cts::GLSL420Pack::Utils::QUALIFIERS>
            ((this->m_test_cases).
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1,&local_2c);
  local_2c = QUAL_MEDIUMP;
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::emplace_back<gl4cts::GLSL420Pack::Utils::QUALIFIERS>
            ((this->m_test_cases).
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2,&local_2c);
  local_2c = QVar1;
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::emplace_back<gl4cts::GLSL420Pack::Utils::QUALIFIERS>
            ((this->m_test_cases).
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2,&local_2c);
  local_2c = QVar2;
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::emplace_back<gl4cts::GLSL420Pack::Utils::QUALIFIERS>
            ((this->m_test_cases).
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2,&local_2c);
  local_2c = QVar2;
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::emplace_back<gl4cts::GLSL420Pack::Utils::QUALIFIERS>
            ((this->m_test_cases).
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 3,&local_2c);
  local_2c = QVar1;
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::emplace_back<gl4cts::GLSL420Pack::Utils::QUALIFIERS>
            ((this->m_test_cases).
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 3,&local_2c);
  local_2c = QUAL_MEDIUMP;
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::emplace_back<gl4cts::GLSL420Pack::Utils::QUALIFIERS>
            ((this->m_test_cases).
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 3,&local_2c);
  local_2c = QUAL_LOWP;
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::emplace_back<gl4cts::GLSL420Pack::Utils::QUALIFIERS>
            ((this->m_test_cases).
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 4,&local_2c);
  local_2c = QVar1;
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::emplace_back<gl4cts::GLSL420Pack::Utils::QUALIFIERS>
            ((this->m_test_cases).
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 4,&local_2c);
  local_2c = QVar2;
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::emplace_back<gl4cts::GLSL420Pack::Utils::QUALIFIERS>
            ((this->m_test_cases).
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 4,&local_2c);
  local_2c = QVar2;
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::emplace_back<gl4cts::GLSL420Pack::Utils::QUALIFIERS>
            ((this->m_test_cases).
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 5,&local_2c);
  local_2c = QVar1;
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::emplace_back<gl4cts::GLSL420Pack::Utils::QUALIFIERS>
            ((this->m_test_cases).
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 5,&local_2c);
  local_2c = QUAL_LOWP;
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::emplace_back<gl4cts::GLSL420Pack::Utils::QUALIFIERS>
            ((this->m_test_cases).
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 5,&local_2c);
  return true;
}

Assistant:

bool QualifierOrderFunctionInoutTest::testInit()
{
	m_test_cases.resize(6);

	m_test_cases[0].push_back(Utils::QUAL_HIGHP);
	m_test_cases[0].push_back(Utils::QUAL_PRECISE);
	m_test_cases[0].push_back(Utils::QUAL_INOUT);

	m_test_cases[1].push_back(Utils::QUAL_INOUT);
	m_test_cases[1].push_back(Utils::QUAL_PRECISE);
	m_test_cases[1].push_back(Utils::QUAL_HIGHP);

	m_test_cases[2].push_back(Utils::QUAL_MEDIUMP);
	m_test_cases[2].push_back(Utils::QUAL_PRECISE);
	m_test_cases[2].push_back(Utils::QUAL_INOUT);

	m_test_cases[3].push_back(Utils::QUAL_INOUT);
	m_test_cases[3].push_back(Utils::QUAL_PRECISE);
	m_test_cases[3].push_back(Utils::QUAL_MEDIUMP);

	m_test_cases[4].push_back(Utils::QUAL_LOWP);
	m_test_cases[4].push_back(Utils::QUAL_PRECISE);
	m_test_cases[4].push_back(Utils::QUAL_INOUT);

	m_test_cases[5].push_back(Utils::QUAL_INOUT);
	m_test_cases[5].push_back(Utils::QUAL_PRECISE);
	m_test_cases[5].push_back(Utils::QUAL_LOWP);

	return true;
}